

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  long lVar1;
  tm *ptVar2;
  long *plVar3;
  string *extraout_RAX;
  undefined8 *puVar4;
  string *extraout_RAX_00;
  string *psVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  tm time_struct;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  long *local_250;
  undefined8 local_248;
  long local_240;
  undefined8 uStack_238;
  long *local_230;
  undefined8 local_228;
  long local_220;
  undefined8 uStack_218;
  long *local_210;
  undefined8 local_208;
  long local_200;
  undefined8 uStack_1f8;
  long *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  int local_8c;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  int local_54;
  
  local_270 = (long *)((long)this / 1000);
  ptVar2 = localtime_r((time_t *)&local_270,(tm *)&local_68);
  if (ptVar2 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX;
  }
  local_8c = local_54 + 0x76c;
  StreamableToString<int>((string *)local_88,&local_8c);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_88);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1c0 = *puVar6;
    lStack_1b8 = plVar3[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar6;
    local_1d0 = (ulong *)*plVar3;
  }
  local_1c8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_(&local_b0,(String *)(ulong)(local_58 + 1),2,(int)puVar6);
  uVar8 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar8 = local_1c0;
  }
  if (uVar8 < local_b0._M_string_length + local_1c8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar9 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_b0._M_string_length + local_1c8) goto LAB_0013b90c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_0013b90c:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_b0._M_dataplus._M_p);
  }
  local_250 = &local_240;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_240 = *plVar3;
    uStack_238 = puVar4[3];
  }
  else {
    local_240 = *plVar3;
    local_250 = (long *)*puVar4;
  }
  local_248 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1a0 = *puVar6;
    lStack_198 = plVar3[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar6;
    local_1b0 = (ulong *)*plVar3;
  }
  local_1a8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_(&local_d0,(String *)(ulong)(uint)local_68._12_4_,2,(int)puVar6)
  ;
  uVar8 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar8 = local_1a0;
  }
  if (uVar8 < local_d0._M_string_length + local_1a8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar9 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_d0._M_string_length + local_1a8) goto LAB_0013ba49;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_0013ba49:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_230 = &local_220;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_220 = *plVar3;
    uStack_218 = puVar4[3];
  }
  else {
    local_220 = *plVar3;
    local_230 = (long *)*puVar4;
  }
  local_228 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_230);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_180 = *puVar6;
    lStack_178 = plVar3[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar6;
    local_190 = (ulong *)*plVar3;
  }
  local_188 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_(&local_f0,(String *)(ulong)(uint)local_68._8_4_,2,(int)puVar6);
  uVar8 = 0xf;
  if (local_190 != &local_180) {
    uVar8 = local_180;
  }
  if (uVar8 < local_f0._M_string_length + local_188) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar9 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_f0._M_string_length + local_188) goto LAB_0013bb88;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_0013bb88:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_f0._M_dataplus._M_p);
  }
  local_210 = &local_200;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_200 = *plVar3;
    uStack_1f8 = puVar4[3];
  }
  else {
    local_200 = *plVar3;
    local_210 = (long *)*puVar4;
  }
  local_208 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_210);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_160 = *puVar6;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *puVar6;
    local_170 = (ulong *)*plVar3;
  }
  local_168 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_110,(String *)(ulong)(uint)local_68._M_allocated_capacity._4_4_,2,(int)puVar6);
  uVar8 = 0xf;
  if (local_170 != &local_160) {
    uVar8 = local_160;
  }
  if (uVar8 < local_110._M_string_length + local_168) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar9 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_110._M_string_length + local_168) goto LAB_0013bcc6;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_170);
  }
  else {
LAB_0013bcc6:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_110._M_dataplus._M_p);
  }
  local_1f0 = &local_1e0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1e0 = *plVar3;
    uStack_1d8 = puVar4[3];
  }
  else {
    local_1e0 = *plVar3;
    local_1f0 = (long *)*puVar4;
  }
  local_1e8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_140 = *puVar6;
    lStack_138 = plVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar6;
    local_150 = (ulong *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  String::FormatIntWidthN_abi_cxx11_
            (&local_130,(String *)(ulong)(uint)local_68._M_allocated_capacity._0_4_,2,(int)puVar6);
  uVar8 = 0xf;
  if (local_150 != &local_140) {
    uVar8 = local_140;
  }
  if (uVar8 < local_130._M_string_length + local_148) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar9 = local_130.field_2._M_allocated_capacity;
    }
    if (local_130._M_string_length + local_148 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
      goto LAB_0013be32;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130._M_dataplus._M_p);
LAB_0013be32:
  local_270 = &local_260;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_260 = *plVar3;
    uStack_258 = puVar4[3];
  }
  else {
    local_260 = *plVar3;
    local_270 = (long *)*puVar4;
  }
  local_268 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_270);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  psVar5 = (string *)(local_88 + 0x10);
  if ((string *)local_88._0_8_ != psVar5) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    psVar5 = extraout_RAX_00;
  }
  return psVar5;
}

Assistant:

static std::string FormatEpochTimeInMillisAsRFC3339(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "Z";
}